

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

int write_dns_question(char *buffer,char *question,int class,int type)

{
  int iVar1;
  int iVar2;
  ushort uVar3;
  
  iVar1 = str_to_label(buffer,question,0x208);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    uVar3 = (ushort)class;
    if (0xffff < (uint)class) {
      uVar3 = 0;
    }
    *(ushort *)(buffer + (long)iVar1 + 2) = uVar3 << 8 | uVar3 >> 8;
    iVar2 = 0;
    if ((uint)type < 0x10000) {
      iVar2 = type;
    }
    *(ushort *)(buffer + iVar1) = (ushort)iVar2 << 8 | (ushort)iVar2 >> 8;
    iVar1 = iVar1 + 4;
  }
  return iVar1;
}

Assistant:

int write_dns_question(char *buffer, const char *question, int class,
                       int type) {
  struct question_struct *qu;
  // size_t size =sizeof(struct question_struct);
  int size = str_to_label(buffer, question, MAX_DNS_SIZE); // TODO：max_len
  if (size == -1)
    return -1;
  buffer += size;
  qu = (struct question_struct *)buffer;
  qu->qclass = htons(IN_16b_RANGE(class) ? class : 0); //默认无效值
  qu->qtype = htons(IN_16b_RANGE(type) ? type : 0);    //默认无效值
  size += sizeof(struct question_struct);
  return size;
}